

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_tga.c
# Opt level: O1

int read_header_tga(gdIOCtx *ctx,oTga *tga)

{
  int iVar1;
  char *buf;
  byte bVar2;
  uchar header [18];
  byte local_38;
  uint8_t local_37;
  uint8_t local_36;
  ushort local_35;
  ushort local_33;
  uint8_t local_31;
  ushort local_30;
  ushort local_2e;
  ushort local_2c;
  ushort local_2a;
  uint8_t local_28;
  byte local_27;
  
  iVar1 = gdGetBuf(&local_38,0x12,ctx);
  if (iVar1 < 0x12) {
    gd_error("fail to read header");
  }
  else {
    tga->identsize = local_38;
    tga->colormaptype = local_37;
    tga->imagetype = local_36;
    tga->colormapstart = (uint)local_35;
    tga->colormaplength = (uint)local_33;
    tga->colormapbits = local_31;
    tga->xstart = (uint)local_30;
    tga->ystart = (uint)local_2e;
    tga->width = (uint)local_2c;
    tga->height = (uint)local_2a;
    tga->bits = local_28;
    bVar2 = local_27 & 0xf;
    tga->flipv = (local_27 & 0x20) == 0;
    tga->alphabits = bVar2;
    tga->fliph = local_27 >> 4 & 1;
    if (((local_28 == '\x18') && (bVar2 == 0)) || ((local_28 == ' ' && (bVar2 == 8)))) {
      tga->ident = (char *)0x0;
      if ((ulong)local_38 == 0) {
        return 1;
      }
      buf = (char *)gdMalloc((ulong)local_38);
      tga->ident = buf;
      if (buf != (char *)0x0) {
        gdGetBuf(buf,(uint)tga->identsize,ctx);
        return 1;
      }
    }
    else {
      gd_error_ex(4,"gd-tga: %u bits per pixel with %u alpha bits not supported\n");
    }
  }
  return -1;
}

Assistant:

int read_header_tga(gdIOCtx *ctx, oTga *tga)
{

	unsigned char header[18];

	if (gdGetBuf(header, sizeof(header), ctx) < 18) {
		gd_error("fail to read header");
		return -1;
	}

	tga->identsize = header[0];
	tga->colormaptype = header[1];
	tga->imagetype = header[2];
	tga->colormapstart = header[3] + (header[4] << 8);
	tga->colormaplength = header[5] + (header[6] << 8);
	tga->colormapbits = header[7];
	tga->xstart = header[8] + (header[9] << 8);
	tga->ystart = header[10] + (header[11] << 8);
	tga->width = header[12] + (header[13] << 8);
	tga->height = header[14] + (header[15] << 8);
	tga->bits = header[16];
	tga->alphabits = header[17] & 0x0f;
	tga->fliph = (header[17] & 0x10) ? 1 : 0;
	tga->flipv = (header[17] & 0x20) ? 0 : 1;

#if DEBUG
	printf("format bps: %i\n", tga->bits);
	printf("flip h/v: %i / %i\n", tga->fliph, tga->flipv);
	printf("alpha: %i\n", tga->alphabits);
	printf("wxh: %i %i\n", tga->width, tga->height);
#endif

	if (!((tga->bits == TGA_BPP_24 && tga->alphabits == 0)
		|| (tga->bits == TGA_BPP_32 && tga->alphabits == 8)))
	{
		gd_error_ex(GD_WARNING, "gd-tga: %u bits per pixel with %u alpha bits not supported\n",
			tga->bits, tga->alphabits);
		return -1;
	}

	tga->ident = NULL;

	if (tga->identsize > 0) {
		tga->ident = (char *) gdMalloc(tga->identsize * sizeof(char));
		if(tga->ident == NULL) {
			return -1;
		}

		gdGetBuf(tga->ident, tga->identsize, ctx);
	}

	return 1;
}